

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_sah_builder.h
# Opt level: O2

optional<unsigned_long> __thiscall
bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::try_split
          (BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *this,BBox *bbox,size_t begin
          ,size_t end)

{
  float fVar1;
  pointer pVVar2;
  unsigned_long uVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  _Storage<unsigned_long,_true> _Var9;
  size_t axis_00;
  undefined8 extraout_RDX;
  undefined7 uVar11;
  undefined7 extraout_var;
  undefined8 uVar10;
  Split *this_00;
  size_t axis;
  size_t axis_01;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 in_ZMM5 [64];
  undefined1 in_XMM6 [16];
  optional<unsigned_long> oVar21;
  float split_pos;
  undefined4 uStack_3ac;
  float local_3a4;
  undefined1 local_3a0 [8];
  Split *pSStack_398;
  __extent_storage<18446744073709551615UL> local_390;
  Config *local_388;
  Split best_split;
  PerAxisBins per_axis_bins;
  
  this_00 = (Split *)&per_axis_bins;
  std::
  array<std::array<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::Bin,_8UL>,_3UL>
  ::array((array<std::array<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::Bin,_8UL>,_3UL>
           *)this_00);
  for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
    *(undefined4 *)(local_3a0 + lVar6) = 0x41000000;
  }
  fVar1 = (bbox->min).values[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_3a0;
  fVar20 = pSStack_398._0_4_ / ((bbox->max).values[2] - fVar1);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(bbox->max).values;
  uVar7 = *(ulong *)(bbox->min).values;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar7;
  auVar12 = vsubps_avx(auVar12,auVar18);
  auVar12 = vdivps_avx(auVar19,auVar12);
  local_3a4 = fVar20 * -fVar1;
  for (_split_pos = (_func_int **)begin; _split_pos < end;
      _split_pos = (_func_int **)((long)_split_pos + 1)) {
    pVVar2 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).centers_._M_ptr;
    auVar5._4_4_ = auVar12._4_4_ * -(float)(uVar7 >> 0x20);
    auVar5._0_4_ = auVar12._0_4_ * -(float)uVar7;
    auVar5._8_4_ = auVar12._8_4_ * -0.0;
    auVar5._12_4_ = auVar12._12_4_ * -0.0;
    uVar3 = (this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)_split_pos];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)pVVar2[uVar3].values;
    local_388 = (Config *)&split_pos;
    auVar18 = vfmadd132ps_fma(auVar13,auVar5,auVar12);
    auVar19 = vfmadd132ss_fma(ZEXT416((uint)pVVar2[uVar3].values[2]),ZEXT416((uint)local_3a4),
                              ZEXT416((uint)fVar20));
    best_split.bin_id = vmovlps_avx(auVar18);
    best_split.cost = auVar19._0_4_;
    local_3a0 = (undefined1  [8])&best_split;
    pSStack_398 = this_00;
    local_390._M_extent_value = (size_t)this;
    fill_bins::anon_class_32_4_337ade70::operator()((anon_class_32_4_337ade70 *)local_3a0,0);
    fill_bins::anon_class_32_4_337ade70::operator()((anon_class_32_4_337ade70 *)local_3a0,1);
    fill_bins::anon_class_32_4_337ade70::operator()((anon_class_32_4_337ade70 *)local_3a0,2);
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(bbox->min).values;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(bbox->max).values;
  auVar18 = vsubps_avx(auVar16,auVar14);
  auVar12 = vmovshdup_avx(auVar18);
  local_3a0 = (undefined1  [8])vmovlps_avx(auVar18);
  uVar7 = (ulong)(auVar18._0_4_ < auVar12._0_4_);
  axis_00 = 2;
  if ((bbox->max).values[2] - (bbox->min).values[2] <= *(float *)(local_3a0 + uVar7 * 4)) {
    axis_00 = uVar7;
  }
  best_split.bin_id = 4;
  best_split.cost = 3.4028235e+38;
  best_split.axis = axis_00;
  for (axis_01 = 0; axis_01 != 3; axis_01 = axis_01 + 1) {
    find_best_split(this,axis_01,(Bins *)this_00,&best_split);
    this_00 = (Split *)&this_00[10].axis;
  }
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(bbox->min).values;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(bbox->max).values;
  _Var9 = (_Storage<unsigned_long,_true>)
          (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  auVar18 = vsubps_avx(auVar17,auVar15);
  fVar1 = (bbox->max).values[2] - (bbox->min).values[2];
  auVar12 = vmovshdup_avx(auVar18);
  auVar19 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,
                               *(size_t *)(_Var9._M_value + 8) + (end - begin) >>
                               ((ulong)*(byte *)_Var9 & 0x3f));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * auVar12._0_4_)),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(auVar18._0_4_ + auVar12._0_4_)));
  if (auVar12._0_4_ * (auVar19._0_4_ - *(float *)(_Var9._M_value + 0x10)) <= best_split.cost) {
    if (end - begin <= *(size_t *)(_Var9._M_value + 0x20)) {
      uVar10 = 0;
      goto LAB_0010ab98;
    }
LAB_0010ab7f:
    _Var9._M_value = fallback_split(this,axis_00,begin,end);
    uVar11 = extraout_var;
  }
  else {
    local_3a0 = (undefined1  [8])vmovlps_avx(auVar18);
    pSStack_398 = (Split *)CONCAT44(pSStack_398._4_4_,fVar1);
    local_390._M_extent_value = (size_t)&split_pos;
    auVar12 = vcvtusi2ss_avx512f(in_XMM6,best_split.bin_id);
    auVar12 = vfmadd213ss_fma(auVar12,ZEXT416((uint)(*(float *)(local_3a0 + best_split.axis * 4) *
                                                    0.125)),
                              ZEXT416((uint)(bbox->min).values[best_split.axis]));
    _split_pos = (_func_int **)CONCAT44(uStack_3ac,auVar12._0_4_);
    puVar4 = (this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_3a0 = (undefined1  [8])this;
    pSStack_398 = &best_split;
    _Var8 = std::
            __partition<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,8ul>::try_split(bvh::v2::BBox<float,3ul>const&,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>
                      (puVar4 + begin,puVar4 + end);
    _Var9._M_value =
         (long)_Var8._M_current -
         (long)(this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar11 = (undefined7)((ulong)extraout_RDX >> 8);
    if (_Var9._M_value == begin || _Var9._M_value == end) goto LAB_0010ab7f;
  }
  uVar10 = CONCAT71(uVar11,1);
LAB_0010ab98:
  oVar21.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar10;
  oVar21.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var9._M_value;
  return (optional<unsigned_long>)
         oVar21.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        PerAxisBins per_axis_bins;
        fill_bins(per_axis_bins, bbox, begin, end);

        auto largest_axis = bbox.get_diagonal().get_largest_axis();
        auto best_split = Split { BinCount / 2, std::numeric_limits<Scalar>::max(), largest_axis };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, per_axis_bins[axis], best_split);

        // Make sure that the split is good before proceeding with it
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;
            return fallback_split(largest_axis, begin, end);
        }

        auto split_pos = fast_mul_add(
            bbox.get_diagonal()[best_split.axis] / static_cast<Scalar>(BinCount),
            static_cast<Scalar>(best_split.bin_id),
            bbox.min[best_split.axis]);

        size_t index = std::partition(prim_ids_.begin() + begin, prim_ids_.begin() + end,
            [&] (size_t i) { return centers_[i][best_split.axis] < split_pos; }) - prim_ids_.begin();
        if (index == begin || index == end)
            return fallback_split(largest_axis, begin, end);

        return std::make_optional(index);
    }